

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_bigint<std::allocator<unsigned_char>>::
write_string<char,std::char_traits<char>,std::allocator<char>>
          (basic_bigint<std::allocator<unsigned_char>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  size_type sVar2;
  ulong in_RSI;
  basic_bigint<std::allocator<unsigned_char>_> *in_RDI;
  size_type j;
  basic_bigint<std::allocator<unsigned_char>_> LP10;
  basic_bigint<std::allocator<unsigned_char>_> R;
  uint64_t r;
  size_t len;
  basic_bigint<std::allocator<unsigned_char>_> v;
  bool in_stack_000001d7;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000001d8;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000001e0;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000001e8;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_000001f0;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_fffffffffffffef0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff00;
  basic_bigint<std::allocator<unsigned_char>_> *this_00;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff28;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  basic_bigint<std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  basic_bigint<std::allocator<unsigned_char>_> local_80;
  basic_bigint<std::allocator<unsigned_char>_> *local_58;
  long local_40;
  basic_bigint<std::allocator<unsigned_char>_> local_38;
  ulong local_10;
  
  this_00 = &local_38;
  local_10 = in_RSI;
  basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  sVar2 = basic_bigint<std::allocator<unsigned_char>_>::length(this_00);
  local_40 = (sVar2 << 6) / 3 + 2;
  std::__cxx11::string::reserve(local_10);
  sVar2 = basic_bigint<std::allocator<unsigned_char>_>::length(&local_38);
  if (sVar2 == 0) {
    std::__cxx11::string::push_back((char)local_10);
  }
  else {
    if (basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 == 1) {
      for (; basic_bigint<std::allocator<unsigned_char>_>::
             write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 <
             0x199999999999999a;
          basic_bigint<std::allocator<unsigned_char>_>::
          write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 =
               basic_bigint<std::allocator<unsigned_char>_>::
               write_string<char,_std::char_traits<char>,_std::allocator<char>_>::p10 * 10) {
        basic_bigint<std::allocator<unsigned_char>_>::
        write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 =
             basic_bigint<std::allocator<unsigned_char>_>::
             write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10 + 1;
      }
    }
    basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
              ((basic_bigint<std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff00._M_current)
    ;
    basic_bigint<std::allocator<unsigned_char>_>::basic_bigint<unsigned_long>
              (this_00,(unsigned_long)in_RDI,in_stack_ffffffffffffff00._M_current);
    do {
      basic_bigint<std::allocator<unsigned_char>_>::basic_bigint
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      basic_bigint<std::allocator<unsigned_char>_>::divide
                (in_stack_000001f0,in_stack_000001e8,in_stack_000001e0,in_stack_000001d8,
                 in_stack_000001d7);
      basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffef0);
      sVar2 = basic_bigint<std::allocator<unsigned_char>_>::length(&local_80);
      if (sVar2 == 0) {
        __last._M_current = (char *)0x0;
      }
      else {
        in_stack_ffffffffffffff00._M_current =
             (char *)basic_bigint<std::allocator<unsigned_char>_>::data(in_stack_ffffffffffffff40);
        __last._M_current = *(char **)in_stack_ffffffffffffff00._M_current;
      }
      local_58 = (basic_bigint<std::allocator<unsigned_char>_> *)__last._M_current;
      for (in_stack_ffffffffffffff28 = (basic_bigint<std::allocator<unsigned_char>_> *)0x0;
          in_stack_ffffffffffffff28 <
          basic_bigint<std::allocator<unsigned_char>_>::
          write_string<char,_std::char_traits<char>,_std::allocator<char>_>::ip10;
          in_stack_ffffffffffffff28 =
               (basic_bigint<std::allocator<unsigned_char>_> *)&in_stack_ffffffffffffff28->field_0x1
          ) {
        std::__cxx11::string::push_back((char)local_10);
        in_stack_fffffffffffffef0 =
             (basic_bigint<std::allocator<unsigned_char>_> *)((ulong)local_58 / 10);
        local_58 = in_stack_fffffffffffffef0;
        sVar2 = basic_bigint<std::allocator<unsigned_char>_>::length(&local_38);
        if (&in_stack_fffffffffffffef0->field_0x0 + sVar2 == (undefined1 *)0x0) break;
      }
      sVar2 = basic_bigint<std::allocator<unsigned_char>_>::length(&local_38);
    } while (sVar2 != 0);
    bVar1 = basic_bigint<std::allocator<unsigned_char>_>::is_negative(in_RDI);
    if (bVar1) {
      std::__cxx11::string::push_back((char)local_10);
    }
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (in_stack_ffffffffffffff00,__last);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffef0);
    basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffef0);
  }
  basic_bigint<std::allocator<unsigned_char>_>::~basic_bigint(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void write_string(std::basic_string<Ch,Traits,Alloc>& data) const
    {
        basic_bigint<Allocator> v(*this);

        std::size_t len = (v.length() * basic_type_bits / 3) + 2;
        data.reserve(len);

        static uint64_t p10 = 1;
        static uint64_t ip10 = 0;

        if ( v.length() == 0 )
        {
            data.push_back('0');
        }
        else
        {
            uint64_t r;
            if ( p10 == 1 )
            {
                while ( p10 <= max_uint64_div_10)
                {
                    p10 *= 10u;
                    ip10++;
                }
            }                     
            // p10 is max unsigned power of 10
            basic_bigint<Allocator> R;
            basic_bigint<Allocator> LP10 = p10; // LP10 = p10 = ::pow(10, ip10)

            do
            {
                v.divide( LP10, v, R, true );
                r = (R.length() ? R.data()[0] : 0);
                for ( size_type j=0; j < ip10; j++ )
                {
                    data.push_back(char(r % 10u + '0'));
                    r /= 10u;
                    if ( r + v.length() == 0 )
                        break;
                }
            } 
            while ( v.length() );
            if (is_negative())
            {
                data.push_back('-');
            }
            std::reverse(data.begin(),data.end());
        }
    }